

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTerminalAttribute<tinyusdz::value::point3f>::TypedTerminalAttribute
          (TypedTerminalAttribute<tinyusdz::value::point3f> *this)

{
  AttrMetas::AttrMetas(&this->_metas);
  this->_authored = false;
  (this->_actual_type_name)._M_dataplus._M_p = (pointer)&(this->_actual_type_name).field_2;
  (this->_actual_type_name)._M_string_length = 0;
  (this->_actual_type_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

void set_authored(bool onoff) { _authored = onoff; }